

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_init.c
# Opt level: O2

void png_init_filter_functions_sse2(png_structp pp,uint bpp)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  
  if (bpp == 3) {
    pcVar1 = png_read_filter_row_paeth3_sse2;
    pcVar2 = png_read_filter_row_avg3_sse2;
    pcVar3 = png_read_filter_row_sub3_sse2;
  }
  else {
    if (bpp != 4) {
      return;
    }
    pcVar1 = png_read_filter_row_paeth4_sse2;
    pcVar2 = png_read_filter_row_avg4_sse2;
    pcVar3 = png_read_filter_row_sub4_sse2;
  }
  pp->read_filter[0] = pcVar3;
  pp->read_filter[2] = pcVar2;
  pp->read_filter[3] = pcVar1;
  return;
}

Assistant:

void
png_init_filter_functions_sse2(png_structp pp, unsigned int bpp)
{
   /* The techniques used to implement each of these filters in SSE operate on
    * one pixel at a time.
    * So they generally speed up 3bpp images about 3x, 4bpp images about 4x.
    * They can scale up to 6 and 8 bpp images and down to 2 bpp images,
    * but they'd not likely have any benefit for 1bpp images.
    * Most of these can be implemented using only MMX and 64-bit registers,
    * but they end up a bit slower than using the equally-ubiquitous SSE2.
   */
   png_debug(1, "in png_init_filter_functions_sse2");
   if (bpp == 3)
   {
      pp->read_filter[PNG_FILTER_VALUE_SUB-1] = png_read_filter_row_sub3_sse2;
      pp->read_filter[PNG_FILTER_VALUE_AVG-1] = png_read_filter_row_avg3_sse2;
      pp->read_filter[PNG_FILTER_VALUE_PAETH-1] =
         png_read_filter_row_paeth3_sse2;
   }
   else if (bpp == 4)
   {
      pp->read_filter[PNG_FILTER_VALUE_SUB-1] = png_read_filter_row_sub4_sse2;
      pp->read_filter[PNG_FILTER_VALUE_AVG-1] = png_read_filter_row_avg4_sse2;
      pp->read_filter[PNG_FILTER_VALUE_PAETH-1] =
          png_read_filter_row_paeth4_sse2;
   }

   /* No need optimize PNG_FILTER_VALUE_UP.  The compiler should
    * autovectorize.
    */
}